

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O3

void vinlet_dsp(t_vinlet *x,t_signal **sp)

{
  t_signal *sig;
  
  if (x->x_buf != (t_sample *)0x0) {
    sig = *sp;
    if (x->x_directsignal != (t_signal *)0x0) {
      signal_setborrowed(sig,x->x_directsignal);
      return;
    }
    dsp_add(vinlet_perform,3,x,sig->s_vec,(long)sig->s_vecsize);
    x->x_read = x->x_buf;
  }
  return;
}

Assistant:

static void vinlet_dsp(t_vinlet *x, t_signal **sp)
{
    t_signal *outsig;
        /* no buffer means we're not a signal inlet */
    if (!x->x_buf)
        return;
    outsig = sp[0];
    if (x->x_directsignal)
    {
        signal_setborrowed(sp[0], x->x_directsignal);
    }
    else
    {
        dsp_add(vinlet_perform, 3, x, outsig->s_vec, (t_int)outsig->s_vecsize);
        x->x_read = x->x_buf;
    }
}